

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O2

void deleteForeign(string *val)

{
  ostream *poVar1;
  assertion_result local_88;
  const_string local_70;
  char *local_60;
  char *local_58;
  const_string local_50;
  const_string local_40;
  lazy_ostream local_30;
  undefined8 *local_20;
  char **local_18;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Deleting foreign string containing ");
  poVar1 = std::operator<<(poVar1,(string *)val);
  std::operator<<(poVar1,'\n');
  local_40.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_40.m_end = "";
  local_50.m_begin = "";
  local_50.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)poVar1,&local_40,0x40c,&local_50);
  local_88.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)safeToDelete;
  local_88.m_message.px = (element_type *)0x0;
  local_88.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_18 = &local_60;
  local_60 = "safeToDelete";
  local_58 = "";
  local_30.m_empty = false;
  local_30._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001eab88;
  local_20 = &boost::unit_test::lazy_ostream::inst;
  local_70.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_70.m_end = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_88,&local_30,&local_70,0x40c,CHECK,CHECK_PRED,0);
  boost::detail::shared_count::~shared_count(&local_88.m_message.pn);
  return;
}

Assistant:

void deleteForeign(const std::string &val) 
{
    std::cout << "Deleting foreign string containing " << val << '\n';
    BOOST_CHECK(safeToDelete);
}